

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O1

void GPU_GetRegisteredRendererList(GPU_RendererID *renderers_array)

{
  GPU_RendererID *pGVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  
  gpu_init_renderer_register();
  iVar3 = 0;
  lVar4 = 8;
  do {
    if (*(int *)((long)&_gpu_renderer_register[0].id.name + lVar4) != 0) {
      *(undefined8 *)&renderers_array[iVar3].minor_version =
           *(undefined8 *)((long)&_gpu_renderer_register[0].id.renderer + lVar4);
      uVar2 = *(undefined8 *)((long)&_gpu_renderer_register[0].id.name + lVar4);
      pGVar1 = renderers_array + iVar3;
      pGVar1->name = *(char **)((long)_gpu_renderer_map + lVar4 + 0x98);
      pGVar1->renderer = (int)uVar2;
      pGVar1->major_version = (int)((ulong)uVar2 >> 0x20);
      iVar3 = iVar3 + 1;
    }
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0x198);
  return;
}

Assistant:

void GPU_GetRegisteredRendererList(GPU_RendererID* renderers_array)
{
	int count;
	int i;

	gpu_init_renderer_register();

	count = 0;
	for(i = 0; i < GPU_MAX_REGISTERED_RENDERERS; i++)
	{
		if(_gpu_renderer_register[i].id.renderer != GPU_RENDERER_UNKNOWN)
		{
			renderers_array[count] = _gpu_renderer_register[i].id;
			count++;
		}
	}
}